

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

void socket_error_callback(void *vs)

{
  void *pvVar1;
  
  pvVar1 = find234(sktree,vs,(cmpfn234)0x0);
  if ((pvVar1 != (void *)0x0) && (*(int *)((long)vs + 0x5c) != 0)) {
    plug_closing_errno(*(Plug **)((long)vs + 0x10),*(int *)((long)vs + 0x5c));
    return;
  }
  return;
}

Assistant:

static void socket_error_callback(void *vs)
{
    NetSocket *s = (NetSocket *)vs;

    /*
     * Just in case other socket work has caused this socket to vanish
     * or become somehow non-erroneous before this callback arrived...
     */
    if (!find234(sktree, s, NULL) || !s->pending_error)
        return;

    /*
     * An error has occurred on this socket. Pass it to the plug.
     */
    plug_closing_errno(s->plug, s->pending_error);
}